

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

SequenceRange
slang::ast::SequenceRange::fromSyntax
          (RangeSelectSyntax *syntax,ASTContext *context,bool allowUnbounded)

{
  bool bVar1;
  int iVar2;
  optional<int> oVar3;
  undefined4 extraout_var;
  Diagnostic *pDVar4;
  _Storage<int,_true> arg;
  undefined4 uVar5;
  SourceRange SVar6;
  SequenceRange SVar7;
  _Storage<int,_true> local_38;
  _Storage<int,_true> _Stack_34;
  
  local_38._M_value = 1;
  oVar3 = ASTContext::evalInteger(context,(syntax->left).ptr,(bitmask<slang::ast::ASTFlags>)0x80000)
  ;
  SVar6 = slang::syntax::SyntaxNode::sourceRange(&((syntax->left).ptr)->super_SyntaxNode);
  bVar1 = ASTContext::requirePositive(context,oVar3,SVar6);
  arg._M_value = oVar3.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int>._M_payload;
  if (bVar1) {
    local_38._M_value = arg._M_value;
  }
  iVar2 = Expression::bind((int)(syntax->right).ptr,(sockaddr *)context,
                           (uint)allowUnbounded << 9 | 0x90000);
  bVar1 = Type::isUnbounded((((Expression *)CONCAT44(extraout_var,iVar2))->type).ptr);
  uVar5 = 0;
  if (!bVar1) {
    oVar3 = ASTContext::evalInteger
                      (context,(Expression *)CONCAT44(extraout_var,iVar2),
                       (bitmask<slang::ast::EvalFlags>)0x0);
    SVar6 = slang::syntax::SyntaxNode::sourceRange(&((syntax->right).ptr)->super_SyntaxNode);
    bVar1 = ASTContext::requirePositive(context,oVar3,SVar6);
    if (bVar1) {
      _Stack_34._M_value =
           oVar3.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
      uVar5 = 1;
      if (_Stack_34._M_value < arg._M_value) {
        SVar6 = slang::syntax::SyntaxNode::sourceRange(&((syntax->left).ptr)->super_SyntaxNode);
        pDVar4 = ASTContext::addDiag(context,(DiagCode)0x460008,SVar6);
        SVar6 = slang::syntax::SyntaxNode::sourceRange(&((syntax->right).ptr)->super_SyntaxNode);
        Diagnostic::operator<<(pDVar4,SVar6);
        pDVar4 = Diagnostic::operator<<<int>(pDVar4,arg._M_value);
        Diagnostic::operator<<<int>(pDVar4,_Stack_34._M_value);
      }
    }
  }
  SVar7.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload =
       (_Storage<unsigned_int,_true>)_Stack_34._M_value;
  SVar7.min = local_38._M_value;
  SVar7.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._4_4_ = uVar5;
  return SVar7;
}

Assistant:

SequenceRange SequenceRange::fromSyntax(const RangeSelectSyntax& syntax, const ASTContext& context,
                                        bool allowUnbounded) {
    SequenceRange range;
    auto l = context.evalInteger(*syntax.left, ASTFlags::AssertionDelayOrRepetition);
    if (context.requirePositive(l, syntax.left->sourceRange()))
        range.min = uint32_t(*l);

    // The rhs can be an unbounded '$' so we need extra AST flags.
    bitmask<ASTFlags> flags = ASTFlags::AssertionExpr | ASTFlags::AssertionDelayOrRepetition;
    if (allowUnbounded)
        flags |= ASTFlags::AllowUnboundedLiteral;

    auto& re = Expression::bind(*syntax.right, context, flags);
    if (re.type->isUnbounded())
        return range;

    auto r = context.evalInteger(re);
    if (context.requirePositive(r, syntax.right->sourceRange())) {
        range.max = uint32_t(*r);
        if (*l > *r) {
            auto& diag = context.addDiag(diag::SeqRangeMinMax, syntax.left->sourceRange());
            diag << syntax.right->sourceRange();
            diag << *l << *r;
        }
    }

    return range;
}